

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppression::NonMaximumSuppression
          (NonMaximumSuppression *this,NonMaximumSuppression *from)

{
  SuppressionMethodCase SVar1;
  ClassLabelsCase CVar2;
  InternalMetadataWithArenaLite *this_00;
  string *psVar3;
  long lVar4;
  NonMaximumSuppression_PickTop *this_01;
  NonMaximumSuppression_PickTop *from_00;
  StringVector *this_02;
  StringVector *from_01;
  Int64Vector *this_03;
  Int64Vector *from_02;
  NonMaximumSuppression *from_local;
  NonMaximumSuppression *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NonMaximumSuppression_00d5cb70;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  SuppressionMethodUnion::SuppressionMethodUnion
            ((SuppressionMethodUnion *)&this->SuppressionMethod_);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->confidenceinputfeaturename_,psVar3);
  confidenceinputfeaturename_abi_cxx11_(from);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidenceinputfeaturename_,psVar3,(from->confidenceinputfeaturename_).ptr_);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->coordinatesinputfeaturename_,psVar3);
  coordinatesinputfeaturename_abi_cxx11_(from);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->coordinatesinputfeaturename_,psVar3,(from->coordinatesinputfeaturename_).ptr_)
    ;
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->iouthresholdinputfeaturename_,psVar3);
  iouthresholdinputfeaturename_abi_cxx11_(from);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->iouthresholdinputfeaturename_,psVar3,
               (from->iouthresholdinputfeaturename_).ptr_);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->confidencethresholdinputfeaturename_,psVar3);
  confidencethresholdinputfeaturename_abi_cxx11_(from);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidencethresholdinputfeaturename_,psVar3,
               (from->confidencethresholdinputfeaturename_).ptr_);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->confidenceoutputfeaturename_,psVar3);
  confidenceoutputfeaturename_abi_cxx11_(from);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidenceoutputfeaturename_,psVar3,(from->confidenceoutputfeaturename_).ptr_)
    ;
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
            (&this->coordinatesoutputfeaturename_,psVar3);
  coordinatesoutputfeaturename_abi_cxx11_(from);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->coordinatesoutputfeaturename_,psVar3,
               (from->coordinatesoutputfeaturename_).ptr_);
  }
  memcpy(&this->iouthreshold_,&from->iouthreshold_,(long)this + (0x50 - (long)&this->iouthreshold_))
  ;
  clear_has_SuppressionMethod(this);
  SVar1 = SuppressionMethod_case(from);
  if ((SVar1 != SUPPRESSIONMETHOD_NOT_SET) && (SVar1 == kPickTop)) {
    this_01 = mutable_picktop(this);
    from_00 = picktop(from);
    NonMaximumSuppression_PickTop::MergeFrom(this_01,from_00);
  }
  clear_has_ClassLabels(this);
  CVar2 = ClassLabels_case(from);
  if (CVar2 != CLASSLABELS_NOT_SET) {
    if (CVar2 == kStringClassLabels) {
      this_02 = mutable_stringclasslabels(this);
      from_01 = stringclasslabels(from);
      StringVector::MergeFrom(this_02,from_01);
    }
    else if (CVar2 == kInt64ClassLabels) {
      this_03 = mutable_int64classlabels(this);
      from_02 = int64classlabels(from);
      Int64Vector::MergeFrom(this_03,from_02);
    }
  }
  return;
}

Assistant:

NonMaximumSuppression::NonMaximumSuppression(const NonMaximumSuppression& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  confidenceinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.confidenceinputfeaturename().size() > 0) {
    confidenceinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceinputfeaturename_);
  }
  coordinatesinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.coordinatesinputfeaturename().size() > 0) {
    coordinatesinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesinputfeaturename_);
  }
  iouthresholdinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.iouthresholdinputfeaturename().size() > 0) {
    iouthresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iouthresholdinputfeaturename_);
  }
  confidencethresholdinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.confidencethresholdinputfeaturename().size() > 0) {
    confidencethresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidencethresholdinputfeaturename_);
  }
  confidenceoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.confidenceoutputfeaturename().size() > 0) {
    confidenceoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceoutputfeaturename_);
  }
  coordinatesoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.coordinatesoutputfeaturename().size() > 0) {
    coordinatesoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesoutputfeaturename_);
  }
  ::memcpy(&iouthreshold_, &from.iouthreshold_,
    reinterpret_cast<char*>(&confidencethreshold_) -
    reinterpret_cast<char*>(&iouthreshold_) + sizeof(confidencethreshold_));
  clear_has_SuppressionMethod();
  switch (from.SuppressionMethod_case()) {
    case kPickTop: {
      mutable_picktop()->::CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom(from.picktop());
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NonMaximumSuppression)
}